

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestProtocols.h
# Opt level: O1

void __thiscall B::B(B *this,ostream *outStream)

{
  (this->super_StreamWriter).stream = outStream;
  BaseObserverProtocol::BaseObserverProtocol((BaseObserverProtocol *)this);
  (this->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__BaseObserverProtocol_0015dd90;
  BaseObserverProtocol::BaseObserverProtocol
            (&(this->super_TicTacProtocol).super_BaseObserverProtocol);
  (this->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_0015de00;
  (this->super_TicTacProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_0015de38;
  return;
}

Assistant:

B(std::ostream& outStream) :
    StreamWriter(outStream) {}